

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  U32 UVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  ushort uVar5;
  U32 n;
  ulong uVar6;
  U32 UVar7;
  U32 n_2;
  HUF_CElt *elt;
  HUF_CElt *elt_00;
  size_t sStackY_1d0;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [13];
  BYTE huffWeight [256];
  
  tableLog = 0;
  nbSymbols = 0;
  sStackY_1d0 = HUF_readStats(huffWeight,0x100,rankVal,&nbSymbols,&tableLog,src,srcSize);
  if (sStackY_1d0 < 0xffffffffffffff89) {
    *hasZeroWeights = (uint)(rankVal[0] != 0);
    uVar6 = (ulong)tableLog;
    if (uVar6 < 0xd) {
      if (*maxSymbolValuePtr + 1 < nbSymbols) {
        sStackY_1d0 = 0xffffffffffffffd0;
      }
      else {
        *CTable = uVar6;
        elt_00 = CTable + 1;
        UVar7 = 0;
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          UVar1 = rankVal[uVar4 + 1];
          bVar3 = (byte)uVar4;
          rankVal[uVar4 + 1] = UVar7;
          UVar7 = (UVar1 << (bVar3 & 0x1f)) + UVar7;
        }
        elt = elt_00;
        for (uVar6 = 0; uVar6 < nbSymbols; uVar6 = uVar6 + 1) {
          uVar2 = (uint)(byte)(((char)tableLog - huffWeight[uVar6]) + 1);
          if (huffWeight[uVar6] == '\0') {
            uVar2 = 0;
          }
          HUF_setNbBits(elt,(ulong)uVar2);
          elt = elt + 1;
        }
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0xd] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank[8] = 0;
        valPerRank[9] = 0;
        valPerRank[10] = 0;
        valPerRank[0xb] = 0;
        valPerRank[0xc] = 0;
        valPerRank[0xd] = 0;
        valPerRank[0] = 0;
        valPerRank[1] = 0;
        valPerRank[2] = 0;
        valPerRank[3] = 0;
        valPerRank[4] = 0;
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        for (uVar6 = 0; nbSymbols != uVar6; uVar6 = uVar6 + 1) {
          nbPerRank[(byte)elt_00[uVar6]] = nbPerRank[(byte)elt_00[uVar6]] + 1;
        }
        valPerRank[tableLog + 1] = 0;
        uVar5 = 0;
        uVar6 = (ulong)tableLog;
        while (uVar6 != 0) {
          valPerRank[uVar6] = uVar5;
          uVar5 = (ushort)(uVar5 + nbPerRank[uVar6]) >> 1;
          uVar6 = uVar6 - 1;
        }
        for (uVar6 = 0; uVar6 < nbSymbols; uVar6 = uVar6 + 1) {
          uVar5 = valPerRank[(byte)*elt_00];
          valPerRank[(byte)*elt_00] = uVar5 + 1;
          HUF_setValue(elt_00,(ulong)uVar5);
          elt_00 = elt_00 + 1;
        }
        *maxSymbolValuePtr = nbSymbols - 1;
      }
    }
    else {
      sStackY_1d0 = 0xffffffffffffffd4;
    }
  }
  return sStackY_1d0;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    CTable[0] = tableLog;

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}